

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O3

void yyTraceShift(yyParser_conflict *yypParser,int yyNewState)

{
  undefined8 in_R9;
  
  if (yyTraceFILE != (FILE *)0x0) {
    if (yyNewState < 0x150) {
      fprintf((FILE *)yyTraceFILE,"%sShift \'%s\', go to state %d\n",yyTracePrompt,
              yyTokenName[yypParser->yytos->major],(ulong)(uint)yyNewState,in_R9,yypParser);
    }
    else {
      fprintf((FILE *)yyTraceFILE,"%sShift \'%s\'\n",yyTracePrompt,
              yyTokenName[yypParser->yytos->major],(ulong)(uint)yyNewState,in_R9,yypParser);
    }
    fflush((FILE *)yyTraceFILE);
    return;
  }
  return;
}

Assistant:

static void yyTraceShift(yyParser *yypParser, int yyNewState){
  if( yyTraceFILE ){
    if( yyNewState<YYNSTATE ){
      fprintf(yyTraceFILE,"%sShift '%s', go to state %d\n",
         yyTracePrompt,yyTokenName[yypParser->yytos->major],
         yyNewState);
    }else{
      fprintf(yyTraceFILE,"%sShift '%s'\n",
         yyTracePrompt,yyTokenName[yypParser->yytos->major]);
    }
    fflush(yyTraceFILE);
  }
}